

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O0

void __thiscall OpenMD::SC::calcDensity(SC *this,InteractionData *idat)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference this_00;
  reference pvVar4;
  int *in_RSI;
  long in_RDI;
  RealType RVar5;
  SC *unaff_retaddr;
  RealType rho;
  RealType rcij;
  SCInteractionData *mixer;
  int sctid2;
  int sctid1;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    initialize(unaff_retaddr);
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)*in_RSI);
  iVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_RSI[1]);
  iVar2 = *pvVar3;
  this_00 = std::
            vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
            ::operator[]((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                          *)(in_RDI + 0x90),(long)iVar1);
  pvVar4 = std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::
           operator[](this_00,(long)iVar2);
  if (*(double *)(in_RSI + 8) < pvVar4->rCut) {
    RVar5 = CubicSpline::getValueAt((CubicSpline *)this,(RealType *)idat);
    *(double *)(in_RSI + 0xb0) = RVar5 + *(double *)(in_RSI + 0xb0);
    *(double *)(in_RSI + 0xb2) = RVar5 + *(double *)(in_RSI + 0xb2);
  }
  return;
}

Assistant:

void SC::calcDensity(InteractionData& idat) {
    if (!initialized_) initialize();
    int sctid1 = SCtids[idat.atid1];
    int sctid2 = SCtids[idat.atid2];

    SCInteractionData& mixer = MixingMap[sctid1][sctid2];

    RealType rcij = mixer.rCut;

    if (idat.rij < rcij) {
      RealType rho = mixer.phi->getValueAt(idat.rij);
      idat.rho1 += rho;
      idat.rho2 += rho;
    }

    return;
  }